

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator::GenerateFieldInfo
          (ImmutableEnumOneofFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  long lVar1;
  FieldDescriptor *descriptor;
  uint32 number;
  
  WriteUInt32ToUtf16CharSequence
            (*(uint32 *)((this->super_ImmutableEnumFieldLiteGenerator).descriptor_ + 0x44),output);
  number = GetExperimentalJavaFieldType((this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  WriteUInt32ToUtf16CharSequence(number,output);
  lVar1 = *(long *)((this->super_ImmutableEnumFieldLiteGenerator).descriptor_ + 0x58);
  WriteUInt32ToUtf16CharSequence
            ((int)((ulong)(lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x30)) >> 4) * -0x55555555,
             output);
  descriptor = (this->super_ImmutableEnumFieldLiteGenerator).descriptor_;
  if (*(int *)(*(long *)(descriptor + 0x28) + 0x3c) == 3) {
    return;
  }
  PrintEnumVerifierLogic
            (printer,descriptor,&(this->super_ImmutableEnumFieldLiteGenerator).variables_,"$type$",
             ",\n",(((this->super_ImmutableEnumFieldLiteGenerator).context_)->options_).enforce_lite
            );
  return;
}

Assistant:

void ImmutableEnumOneofFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  WriteIntToUtf16CharSequence(descriptor_->containing_oneof()->index(), output);
  if (SupportFieldPresence(descriptor_->file())) {
    PrintEnumVerifierLogic(printer, descriptor_, variables_,
                           /*var_name=*/"$type$",
                           /*terminating_string=*/",\n",
                           /*enforce_lite=*/context_->EnforceLite());
  }
}